

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_set_meta(fy_node *fyn,void *meta)

{
  fy_document *pfVar1;
  fy_document *fyd;
  void *meta_local;
  fy_node *fyn_local;
  
  if ((fyn == (fy_node *)0x0) || (fyn->fyd == (fy_document *)0x0)) {
    fyn_local._4_4_ = -1;
  }
  else {
    pfVar1 = fyn->fyd;
    if ((((byte)fyn->field_0x34 >> 2 & 1) != 0) &&
       (pfVar1->meta_clear_fn != (fy_node_meta_clear_fn)0x0)) {
      (*pfVar1->meta_clear_fn)(fyn,fyn->meta,pfVar1->meta_user);
    }
    fyn->meta = meta;
    fyn->field_0x34 = fyn->field_0x34 & 0xfb | 4;
    fyn_local._4_4_ = 0;
  }
  return fyn_local._4_4_;
}

Assistant:

int fy_node_set_meta(struct fy_node *fyn, void *meta) {
    struct fy_document *fyd;

    if (!fyn || !fyn->fyd)
        return -1;

    fyd = fyn->fyd;
    if (fyn->has_meta && fyd->meta_clear_fn)
        fyd->meta_clear_fn(fyn, fyn->meta, fyd->meta_user);
    fyn->meta = meta;
    fyn->has_meta = true;

    return 0;
}